

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImGuiID __thiscall ImGuiWindow::GetID(ImGuiWindow *this,char *str,char *str_end)

{
  ImU32 IVar1;
  value_type_conflict3 *pvVar2;
  int data_size;
  
  pvVar2 = ImVector<unsigned_int>::back(&this->IDStack);
  data_size = 0;
  if (str_end != (char *)0x0) {
    data_size = (int)str_end - (int)str;
  }
  IVar1 = ImHash(str,data_size,*pvVar2);
  if (GImGui->ActiveId == IVar1) {
    GImGui->ActiveIdIsAlive = true;
  }
  return IVar1;
}

Assistant:

ImGuiID ImGuiWindow::GetID(const char* str, const char* str_end)
{
    ImGuiID seed = IDStack.back();
    ImGuiID id = ImHash(str, str_end ? (int)(str_end - str) : 0, seed);
    ImGui::KeepAliveID(id);
    return id;
}